

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O1

void icetCompressedSubComposite
               (IceTImage destBuffer,IceTSizeType offset,IceTSparseImage srcBuffer,int srcOnTop)

{
  byte bVar1;
  bool bVar2;
  int *piVar3;
  int iVar4;
  IceTFloat *pIVar5;
  IceTUInt *pIVar6;
  IceTFloat *pIVar7;
  int iVar8;
  float fVar9;
  IceTFloat IVar10;
  int *piVar11;
  float *pfVar12;
  IceTFloat *pIVar13;
  IceTBitField level;
  long lVar14;
  int iVar15;
  IceTEnum type;
  long lVar16;
  long lVar17;
  uint uVar18;
  char *pcVar19;
  float *pfVar20;
  IceTFloat *pIVar21;
  int iVar22;
  float *pfVar23;
  float fVar24;
  IceTEnum _composite_mode;
  IceTUInt _background_color;
  IceTEnum local_4c;
  IceTFloat local_48 [6];
  
  icetTimingBlendBegin();
  if (srcOnTop == 0) {
    icetGetEnumv(0x28,&local_4c);
    if (srcBuffer.opaque_internals == (IceTVoid *)0x0) {
      iVar15 = 0xc000;
      iVar22 = 0xd000;
      iVar4 = 0;
    }
    else {
      iVar15 = *(int *)((long)srcBuffer.opaque_internals + 4);
      iVar22 = *(int *)((long)srcBuffer.opaque_internals + 8);
      iVar4 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
              *(int *)((long)srcBuffer.opaque_internals + 0xc);
    }
    if (destBuffer.opaque_internals == (IceTVoid *)0x0) {
      iVar8 = 0xc000;
    }
    else {
      iVar8 = *(int *)((long)destBuffer.opaque_internals + 4);
    }
    if (iVar15 == iVar8) {
      if (destBuffer.opaque_internals == (IceTVoid *)0x0) {
        iVar8 = 0xd000;
      }
      else {
        iVar8 = *(int *)((long)destBuffer.opaque_internals + 8);
      }
      if (iVar22 != iVar8) goto LAB_0011371d;
      if (srcBuffer.opaque_internals == (IceTVoid *)0x0) {
        iVar8 = 0;
      }
      else {
        iVar8 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                *(int *)((long)srcBuffer.opaque_internals + 0xc);
      }
      if (iVar4 != iVar8) goto LAB_0011371d;
      if (destBuffer.opaque_internals == (IceTVoid *)0x0) {
        iVar8 = 0;
      }
      else {
        iVar8 = *(int *)((long)destBuffer.opaque_internals + 0x10) *
                *(int *)((long)destBuffer.opaque_internals + 0xc);
      }
      if (iVar8 - offset < iVar4) goto LAB_0011371d;
    }
    else {
LAB_0011371d:
      icetRaiseDiagnostic("Input/output buffers do not agree for decompression.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                          ,0x58);
    }
    if (local_4c == 0x302) {
      if (iVar22 != 0xd000) {
        icetRaiseDiagnostic("Z buffer ignored during blend composite operation.  Output z buffer meaningless."
                            ,0xfffffffa,3,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0xf0);
      }
      if (iVar15 == 0xc000) goto LAB_0011395d;
      if (iVar15 == 0xc002) {
        if ((destBuffer.opaque_internals == (IceTVoid *)0x0) ||
           (*(int *)((long)destBuffer.opaque_internals + 4) != 0xc002)) {
          icetRaiseDiagnostic("Color format is not of type float.",0xfffffffb,1,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                              ,0x2ae);
          lVar14 = 0;
        }
        else {
          lVar14 = (long)destBuffer.opaque_internals + 0x1c;
        }
        icetGetFloatv(5,local_48);
        iVar22 = 0;
        iVar15 = 0;
        if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
          iVar15 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                   *(int *)((long)srcBuffer.opaque_internals + 0xc);
        }
        pfVar23 = (float *)(lVar14 + (long)(offset << 2) * 4);
        pfVar12 = (float *)((long)srcBuffer.opaque_internals + 0x1c);
        do {
          if (iVar15 <= iVar22) break;
          pfVar20 = pfVar12 + 2;
          iVar22 = iVar22 + (int)*pfVar12;
          iVar4 = 0x3a;
          if (iVar15 < iVar22) {
LAB_00113a8a:
            icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                ,iVar4);
            bVar2 = false;
            pfVar12 = pfVar20;
          }
          else {
            pfVar23 = pfVar23 + (long)(int)*pfVar12 * 4;
            fVar9 = pfVar12[1];
            iVar22 = iVar22 + (int)fVar9;
            iVar4 = 0x43;
            if (iVar15 < iVar22) goto LAB_00113a8a;
            bVar2 = true;
            pfVar12 = pfVar20;
            if (0 < (int)fVar9) {
              do {
                fVar24 = 1.0 - pfVar23[3];
                *pfVar23 = *pfVar20 * fVar24 + *pfVar23;
                pfVar23[1] = pfVar20[1] * fVar24 + pfVar23[1];
                pfVar23[2] = pfVar20[2] * fVar24 + pfVar23[2];
                pfVar12 = pfVar20 + 3;
                pfVar20 = pfVar20 + 4;
                pfVar23[3] = fVar24 * *pfVar12 + pfVar23[3];
                pfVar23 = pfVar23 + 4;
                fVar9 = (float)((int)fVar9 + -1);
                pfVar12 = pfVar20;
              } while (fVar9 != 0.0);
            }
          }
        } while (bVar2);
        goto LAB_001139d5;
      }
      if (iVar15 == 0xc001) {
        if ((destBuffer.opaque_internals == (IceTVoid *)0x0) ||
           (*(int *)((long)destBuffer.opaque_internals + 4) != 0xc001)) {
          icetRaiseDiagnostic("Color format is not of type ubyte.",0xfffffffb,1,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                              ,0x292);
          lVar14 = 0;
        }
        else {
          lVar14 = (long)destBuffer.opaque_internals + 0x1c;
        }
        icetGetIntegerv(6,(IceTInt *)local_48);
        iVar22 = 0;
        iVar15 = 0;
        if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
          iVar15 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                   *(int *)((long)srcBuffer.opaque_internals + 0xc);
        }
        lVar14 = lVar14 + (long)offset * 4;
        piVar11 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
        do {
          if (iVar15 <= iVar22) break;
          piVar3 = piVar11 + 2;
          iVar22 = iVar22 + *piVar11;
          iVar4 = 0x3a;
          if (iVar15 < iVar22) {
LAB_00113bc8:
            icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                ,iVar4);
            bVar2 = false;
          }
          else {
            lVar14 = lVar14 + (long)*piVar11 * 4;
            iVar8 = piVar11[1];
            iVar22 = iVar22 + iVar8;
            iVar4 = 0x43;
            if (iVar15 < iVar22) goto LAB_00113bc8;
            bVar2 = true;
            if (0 < iVar8) {
              lVar16 = 0;
              lVar17 = 0;
              do {
                bVar1 = *(byte *)(lVar14 + 3 + lVar17 * 4);
                uVar18 = bVar1 ^ 0xff;
                pcVar19 = (char *)(lVar14 + lVar17 * 4);
                *pcVar19 = *pcVar19 +
                           (char)((ulong)(*(byte *)(piVar3 + lVar17) * uVar18) * 0x1010102 >> 0x20);
                pcVar19 = (char *)(lVar14 + 1 + lVar17 * 4);
                *pcVar19 = *pcVar19 +
                           (char)((ulong)(*(byte *)((long)piVar11 + lVar17 * 4 + 9) * uVar18) *
                                  0x1010102 >> 0x20);
                pcVar19 = (char *)(lVar14 + 2 + lVar17 * 4);
                *pcVar19 = *pcVar19 +
                           (char)((ulong)(*(byte *)((long)piVar11 + lVar17 * 4 + 10) * uVar18) *
                                  0x1010102 >> 0x20);
                *(byte *)(lVar14 + 3 + lVar17 * 4) =
                     (char)((ulong)(*(byte *)((long)piVar11 + lVar17 * 4 + 0xb) * uVar18) *
                            0x1010102 >> 0x20) + bVar1;
                lVar17 = lVar17 + 1;
                lVar16 = lVar16 + -4;
              } while (iVar8 != (int)lVar17);
              lVar14 = lVar14 - lVar16;
              piVar3 = (int *)((long)piVar3 - lVar16);
            }
          }
          piVar11 = piVar3;
        } while (bVar2);
        goto LAB_001139d5;
      }
LAB_0011397d:
      pcVar19 = "Encountered invalid color format.";
      type = 0xffffffff;
      level = 1;
      iVar15 = 0x142;
    }
    else {
      if (local_4c != 0x301) goto LAB_00113889;
      if (iVar22 == 0xd000) goto LAB_0011391a;
      if (iVar22 != 0xd001) goto LAB_0011393d;
      pIVar5 = icetImageGetDepthcf(destBuffer);
      pIVar5 = pIVar5 + offset;
      if (iVar15 == 0xc000) {
        iVar15 = 0;
        iVar22 = 0;
        if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
          iVar22 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                   *(int *)((long)srcBuffer.opaque_internals + 0xc);
        }
        piVar11 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
        do {
          if (iVar22 <= iVar15) break;
          piVar3 = piVar11 + 2;
          iVar15 = iVar15 + *piVar11;
          iVar4 = 0x3a;
          if (iVar22 < iVar15) {
LAB_00113fe9:
            icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                ,iVar4);
            bVar2 = false;
            piVar11 = piVar3;
          }
          else {
            pIVar5 = pIVar5 + *piVar11;
            iVar8 = piVar11[1];
            iVar15 = iVar15 + iVar8;
            iVar4 = 0x43;
            if (iVar22 < iVar15) goto LAB_00113fe9;
            bVar2 = true;
            piVar11 = piVar3;
            if (0 < iVar8) {
              lVar14 = 0;
              lVar16 = 0;
              do {
                if ((float)piVar3[lVar16] < (float)pIVar5[lVar16]) {
                  pIVar5[lVar16] = (IceTFloat)piVar3[lVar16];
                }
                lVar16 = lVar16 + 1;
                lVar14 = lVar14 + -4;
              } while (iVar8 != (int)lVar16);
              piVar11 = (int *)((long)piVar3 - lVar14);
              pIVar5 = (IceTFloat *)((long)pIVar5 - lVar14);
            }
          }
        } while (bVar2);
        goto LAB_001139d5;
      }
      if (iVar15 == 0xc002) {
        pIVar7 = icetImageGetColorf(destBuffer);
        icetGetFloatv(5,local_48);
        iVar22 = 0;
        iVar15 = 0;
        if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
          iVar15 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                   *(int *)((long)srcBuffer.opaque_internals + 0xc);
        }
        pIVar7 = pIVar7 + (offset << 2);
        pIVar13 = (IceTFloat *)((long)srcBuffer.opaque_internals + 0x1c);
        do {
          if (iVar15 <= iVar22) break;
          pIVar21 = pIVar13 + 2;
          IVar10 = *pIVar13;
          iVar22 = iVar22 + (int)IVar10;
          iVar4 = 0x3a;
          if (iVar15 < iVar22) {
LAB_00113ef1:
            icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                ,iVar4);
            bVar2 = false;
            pIVar13 = pIVar21;
          }
          else {
            pIVar7 = pIVar7 + (int)IVar10 * 4;
            pIVar5 = pIVar5 + (int)IVar10;
            IVar10 = pIVar13[1];
            iVar22 = iVar22 + (int)IVar10;
            iVar4 = 0x43;
            if (iVar15 < iVar22) goto LAB_00113ef1;
            bVar2 = true;
            pIVar13 = pIVar21;
            if (0 < (int)IVar10) {
              lVar16 = 0;
              lVar14 = 0;
              do {
                if ((float)pIVar21[4] <= *(float *)((long)pIVar5 + lVar14) &&
                    *(float *)((long)pIVar5 + lVar14) != (float)pIVar21[4]) {
                  pIVar7[lVar14] = *pIVar21;
                  pIVar7[lVar14 + 1] = pIVar21[1];
                  pIVar7[lVar14 + 2] = pIVar21[2];
                  pIVar7[lVar14 + 3] = pIVar21[3];
                  *(IceTFloat *)((long)pIVar5 + lVar14) = pIVar21[4];
                }
                pIVar21 = pIVar21 + 5;
                lVar14 = lVar14 + 4;
                lVar16 = lVar16 + -0x10;
                IVar10 = (IceTFloat)((int)IVar10 + -1);
              } while (IVar10 != 0.0);
              pIVar7 = (IceTFloat *)((long)pIVar7 - lVar16);
              pIVar5 = (IceTFloat *)((long)pIVar5 + lVar14);
              pIVar13 = pIVar21;
            }
          }
        } while (bVar2);
        goto LAB_001139d5;
      }
      if (iVar15 == 0xc001) {
        pIVar6 = icetImageGetColorui(destBuffer);
        icetGetIntegerv(6,(IceTInt *)local_48);
        iVar22 = 0;
        iVar15 = 0;
        if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
          iVar15 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                   *(int *)((long)srcBuffer.opaque_internals + 0xc);
        }
        pIVar6 = pIVar6 + offset;
        piVar11 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
        do {
          if (iVar15 <= iVar22) break;
          piVar3 = piVar11 + 2;
          iVar4 = *piVar11;
          iVar22 = iVar22 + iVar4;
          iVar8 = 0x3a;
          if (iVar15 < iVar22) {
LAB_00113821:
            icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                ,iVar8);
            bVar2 = false;
          }
          else {
            pIVar6 = pIVar6 + iVar4;
            pIVar5 = pIVar5 + iVar4;
            iVar4 = piVar11[1];
            iVar22 = iVar22 + iVar4;
            iVar8 = 0x43;
            if (iVar15 < iVar22) goto LAB_00113821;
            bVar2 = true;
            if (0 < iVar4) {
              lVar16 = 0;
              lVar14 = 0;
              do {
                fVar9 = *(float *)((long)piVar11 + lVar14 * 2 + 0xc);
                if (fVar9 < *(float *)((long)pIVar5 + lVar14)) {
                  *(undefined4 *)((long)pIVar6 + lVar14) =
                       *(undefined4 *)((long)piVar3 + lVar14 * 2);
                  *(float *)((long)pIVar5 + lVar14) = fVar9;
                }
                lVar14 = lVar14 + 4;
                lVar16 = lVar16 + -8;
                iVar4 = iVar4 + -1;
              } while (iVar4 != 0);
              pIVar6 = (IceTUInt *)((long)pIVar6 + lVar14);
              pIVar5 = (IceTFloat *)((long)pIVar5 + lVar14);
              piVar3 = (int *)((long)piVar3 - lVar16);
            }
          }
          piVar11 = piVar3;
        } while (bVar2);
        goto LAB_001139d5;
      }
LAB_001139b2:
      pcVar19 = "Encountered invalid color format.";
      type = 0xffffffff;
      level = 1;
      iVar15 = 0xe2;
    }
  }
  else {
    icetGetEnumv(0x28,&local_4c);
    if (srcBuffer.opaque_internals == (IceTVoid *)0x0) {
      iVar15 = 0xc000;
      iVar22 = 0xd000;
      iVar4 = 0;
    }
    else {
      iVar15 = *(int *)((long)srcBuffer.opaque_internals + 4);
      iVar22 = *(int *)((long)srcBuffer.opaque_internals + 8);
      iVar4 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
              *(int *)((long)srcBuffer.opaque_internals + 0xc);
    }
    if (destBuffer.opaque_internals == (IceTVoid *)0x0) {
      iVar8 = 0xc000;
    }
    else {
      iVar8 = *(int *)((long)destBuffer.opaque_internals + 4);
    }
    if (iVar15 == iVar8) {
      if (destBuffer.opaque_internals == (IceTVoid *)0x0) {
        iVar8 = 0xd000;
      }
      else {
        iVar8 = *(int *)((long)destBuffer.opaque_internals + 8);
      }
      if (iVar22 != iVar8) goto LAB_0011327b;
      if (srcBuffer.opaque_internals == (IceTVoid *)0x0) {
        iVar8 = 0;
      }
      else {
        iVar8 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                *(int *)((long)srcBuffer.opaque_internals + 0xc);
      }
      if (iVar4 != iVar8) goto LAB_0011327b;
      if (destBuffer.opaque_internals == (IceTVoid *)0x0) {
        iVar8 = 0;
      }
      else {
        iVar8 = *(int *)((long)destBuffer.opaque_internals + 0x10) *
                *(int *)((long)destBuffer.opaque_internals + 0xc);
      }
      if (iVar8 - offset < iVar4) goto LAB_0011327b;
    }
    else {
LAB_0011327b:
      icetRaiseDiagnostic("Input/output buffers do not agree for decompression.",0xffffffff,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                          ,0x58);
    }
    if (local_4c == 0x302) {
      if (iVar22 != 0xd000) {
        icetRaiseDiagnostic("Z buffer ignored during blend composite operation.  Output z buffer meaningless."
                            ,0xfffffffa,3,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                            ,0xf0);
      }
      if (iVar15 != 0xc000) {
        if (iVar15 == 0xc002) {
          if ((destBuffer.opaque_internals == (IceTVoid *)0x0) ||
             (*(int *)((long)destBuffer.opaque_internals + 4) != 0xc002)) {
            icetRaiseDiagnostic("Color format is not of type float.",0xfffffffb,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                                ,0x2ae);
            lVar14 = 0;
          }
          else {
            lVar14 = (long)destBuffer.opaque_internals + 0x1c;
          }
          icetGetFloatv(5,local_48);
          iVar22 = 0;
          iVar15 = 0;
          if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
            iVar15 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                     *(int *)((long)srcBuffer.opaque_internals + 0xc);
          }
          pfVar23 = (float *)(lVar14 + (long)(offset << 2) * 4);
          pfVar12 = (float *)((long)srcBuffer.opaque_internals + 0x1c);
          do {
            if (iVar15 <= iVar22) break;
            pfVar20 = pfVar12 + 2;
            iVar22 = iVar22 + (int)*pfVar12;
            iVar4 = 0x3a;
            if (iVar15 < iVar22) {
LAB_0011350b:
              icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                  ,iVar4);
              bVar2 = false;
              pfVar12 = pfVar20;
            }
            else {
              pfVar23 = pfVar23 + (long)(int)*pfVar12 * 4;
              fVar9 = pfVar12[1];
              iVar22 = iVar22 + (int)fVar9;
              iVar4 = 0x43;
              if (iVar15 < iVar22) goto LAB_0011350b;
              bVar2 = true;
              pfVar12 = pfVar20;
              if (0 < (int)fVar9) {
                do {
                  fVar24 = 1.0 - pfVar20[3];
                  *pfVar23 = *pfVar23 * fVar24 + *pfVar20;
                  pfVar23[1] = pfVar23[1] * fVar24 + pfVar20[1];
                  pfVar23[2] = pfVar23[2] * fVar24 + pfVar20[2];
                  pfVar12 = pfVar20 + 3;
                  pfVar20 = pfVar20 + 4;
                  pfVar23[3] = fVar24 * pfVar23[3] + *pfVar12;
                  pfVar23 = pfVar23 + 4;
                  fVar9 = (float)((int)fVar9 + -1);
                  pfVar12 = pfVar20;
                } while (fVar9 != 0.0);
              }
            }
          } while (bVar2);
          goto LAB_001139d5;
        }
        if (iVar15 == 0xc001) {
          if ((destBuffer.opaque_internals == (IceTVoid *)0x0) ||
             (*(int *)((long)destBuffer.opaque_internals + 4) != 0xc001)) {
            icetRaiseDiagnostic("Color format is not of type ubyte.",0xfffffffb,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                                ,0x292);
            lVar14 = 0;
          }
          else {
            lVar14 = (long)destBuffer.opaque_internals + 0x1c;
          }
          icetGetIntegerv(6,(IceTInt *)local_48);
          iVar15 = 0;
          iVar22 = 0;
          if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
            iVar22 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                     *(int *)((long)srcBuffer.opaque_internals + 0xc);
          }
          lVar14 = lVar14 + (long)offset * 4;
          piVar11 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
          do {
            if (iVar22 <= iVar15) break;
            piVar3 = piVar11 + 2;
            iVar15 = iVar15 + *piVar11;
            iVar4 = 0x3a;
            if (iVar22 < iVar15) {
LAB_00113648:
              icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                  ,iVar4);
              bVar2 = false;
            }
            else {
              lVar14 = lVar14 + (long)*piVar11 * 4;
              iVar8 = piVar11[1];
              iVar15 = iVar15 + iVar8;
              iVar4 = 0x43;
              if (iVar22 < iVar15) goto LAB_00113648;
              bVar2 = true;
              if (0 < iVar8) {
                lVar16 = 0;
                lVar17 = 0;
                do {
                  uVar18 = *(byte *)((long)piVar11 + lVar17 * 4 + 0xb) ^ 0xff;
                  *(char *)(lVar14 + lVar17 * 4) =
                       (char)((ulong)(*(byte *)(lVar14 + lVar17 * 4) * uVar18) * 0x1010102 >> 0x20)
                       + (char)piVar3[lVar17];
                  *(char *)(lVar14 + 1 + lVar17 * 4) =
                       (char)((ulong)(*(byte *)(lVar14 + 1 + lVar17 * 4) * uVar18) * 0x1010102 >>
                             0x20) + *(char *)((long)piVar11 + lVar17 * 4 + 9);
                  *(char *)(lVar14 + 2 + lVar17 * 4) =
                       (char)((ulong)(*(byte *)(lVar14 + 2 + lVar17 * 4) * uVar18) * 0x1010102 >>
                             0x20) + *(char *)((long)piVar11 + lVar17 * 4 + 10);
                  *(char *)(lVar14 + 3 + lVar17 * 4) =
                       (char)((ulong)(*(byte *)(lVar14 + 3 + lVar17 * 4) * uVar18) * 0x1010102 >>
                             0x20) + *(char *)((long)piVar11 + lVar17 * 4 + 0xb);
                  lVar17 = lVar17 + 1;
                  lVar16 = lVar16 + -4;
                } while (iVar8 != (int)lVar17);
                lVar14 = lVar14 - lVar16;
                piVar3 = (int *)((long)piVar3 - lVar16);
              }
            }
            piVar11 = piVar3;
          } while (bVar2);
          goto LAB_001139d5;
        }
        goto LAB_0011397d;
      }
LAB_0011395d:
      pcVar19 = "Decompressing image with no data.";
      type = 0xfffffffb;
      level = 3;
      iVar15 = 0x13f;
    }
    else if (local_4c == 0x301) {
      if (iVar22 == 0xd000) {
LAB_0011391a:
        pcVar19 = "Cannot use Z buffer compositing operation with no Z buffer.";
        type = 0xfffffffb;
        level = 1;
        iVar15 = 0xe6;
      }
      else {
        if (iVar22 == 0xd001) {
          pIVar5 = icetImageGetDepthcf(destBuffer);
          pIVar5 = pIVar5 + offset;
          if (iVar15 == 0xc000) {
            iVar15 = 0;
            iVar22 = 0;
            if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
              iVar22 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                       *(int *)((long)srcBuffer.opaque_internals + 0xc);
            }
            piVar11 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
            do {
              if (iVar22 <= iVar15) break;
              piVar3 = piVar11 + 2;
              iVar15 = iVar15 + *piVar11;
              iVar4 = 0x3a;
              if (iVar22 < iVar15) {
LAB_00113e0e:
                icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                    ,iVar4);
                bVar2 = false;
                piVar11 = piVar3;
              }
              else {
                pIVar5 = pIVar5 + *piVar11;
                iVar8 = piVar11[1];
                iVar15 = iVar15 + iVar8;
                iVar4 = 0x43;
                if (iVar22 < iVar15) goto LAB_00113e0e;
                bVar2 = true;
                piVar11 = piVar3;
                if (0 < iVar8) {
                  lVar14 = 0;
                  lVar16 = 0;
                  do {
                    if ((float)piVar3[lVar16] < (float)pIVar5[lVar16]) {
                      pIVar5[lVar16] = (IceTFloat)piVar3[lVar16];
                    }
                    lVar16 = lVar16 + 1;
                    lVar14 = lVar14 + -4;
                  } while (iVar8 != (int)lVar16);
                  pIVar5 = (IceTFloat *)((long)pIVar5 - lVar14);
                  piVar11 = (int *)((long)piVar3 - lVar14);
                }
              }
            } while (bVar2);
            goto LAB_001139d5;
          }
          if (iVar15 == 0xc002) {
            pIVar7 = icetImageGetColorf(destBuffer);
            icetGetFloatv(5,local_48);
            iVar22 = 0;
            iVar15 = 0;
            if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
              iVar15 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                       *(int *)((long)srcBuffer.opaque_internals + 0xc);
            }
            pIVar7 = pIVar7 + (offset << 2);
            pIVar13 = (IceTFloat *)((long)srcBuffer.opaque_internals + 0x1c);
            do {
              if (iVar15 <= iVar22) break;
              pIVar21 = pIVar13 + 2;
              IVar10 = *pIVar13;
              iVar22 = iVar22 + (int)IVar10;
              iVar4 = 0x3a;
              if (iVar15 < iVar22) {
LAB_00113d16:
                icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                    ,iVar4);
                bVar2 = false;
                pIVar13 = pIVar21;
              }
              else {
                pIVar7 = pIVar7 + (int)IVar10 * 4;
                pIVar5 = pIVar5 + (int)IVar10;
                IVar10 = pIVar13[1];
                iVar22 = iVar22 + (int)IVar10;
                iVar4 = 0x43;
                if (iVar15 < iVar22) goto LAB_00113d16;
                bVar2 = true;
                pIVar13 = pIVar21;
                if (0 < (int)IVar10) {
                  lVar14 = 0;
                  lVar16 = 0;
                  do {
                    if ((float)pIVar21[4] <= *(float *)((long)pIVar5 + lVar16) &&
                        *(float *)((long)pIVar5 + lVar16) != (float)pIVar21[4]) {
                      pIVar7[lVar16] = *pIVar21;
                      pIVar7[lVar16 + 1] = pIVar21[1];
                      pIVar7[lVar16 + 2] = pIVar21[2];
                      pIVar7[lVar16 + 3] = pIVar21[3];
                      *(IceTFloat *)((long)pIVar5 + lVar16) = pIVar21[4];
                    }
                    pIVar21 = pIVar21 + 5;
                    lVar16 = lVar16 + 4;
                    lVar14 = lVar14 + -0x10;
                    IVar10 = (IceTFloat)((int)IVar10 + -1);
                  } while (IVar10 != 0.0);
                  pIVar5 = (IceTFloat *)((long)pIVar5 + lVar16);
                  pIVar7 = (IceTFloat *)((long)pIVar7 - lVar14);
                  pIVar13 = pIVar21;
                }
              }
            } while (bVar2);
            goto LAB_001139d5;
          }
          if (iVar15 == 0xc001) {
            pIVar6 = icetImageGetColorui(destBuffer);
            icetGetIntegerv(6,(IceTInt *)local_48);
            iVar22 = 0;
            iVar15 = 0;
            if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
              iVar15 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
                       *(int *)((long)srcBuffer.opaque_internals + 0xc);
            }
            pIVar6 = pIVar6 + offset;
            piVar11 = (int *)((long)srcBuffer.opaque_internals + 0x1c);
            do {
              if (iVar15 <= iVar22) break;
              piVar3 = piVar11 + 2;
              iVar4 = *piVar11;
              iVar22 = iVar22 + iVar4;
              iVar8 = 0x3a;
              if (iVar15 < iVar22) {
LAB_0011337f:
                icetRaiseDiagnostic("Corrupt compressed image.",0xfffffffa,1,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_template_body.h"
                                    ,iVar8);
                bVar2 = false;
              }
              else {
                pIVar6 = pIVar6 + iVar4;
                pIVar5 = pIVar5 + iVar4;
                iVar4 = piVar11[1];
                iVar22 = iVar22 + iVar4;
                iVar8 = 0x43;
                if (iVar15 < iVar22) goto LAB_0011337f;
                bVar2 = true;
                if (0 < iVar4) {
                  lVar14 = 0;
                  lVar16 = 0;
                  do {
                    fVar9 = *(float *)((long)piVar11 + lVar16 * 2 + 0xc);
                    if (fVar9 < *(float *)((long)pIVar5 + lVar16)) {
                      *(undefined4 *)((long)pIVar6 + lVar16) =
                           *(undefined4 *)((long)piVar3 + lVar16 * 2);
                      *(float *)((long)pIVar5 + lVar16) = fVar9;
                    }
                    lVar16 = lVar16 + 4;
                    lVar14 = lVar14 + -8;
                    iVar4 = iVar4 + -1;
                  } while (iVar4 != 0);
                  pIVar5 = (IceTFloat *)((long)pIVar5 + lVar16);
                  pIVar6 = (IceTUInt *)((long)pIVar6 + lVar16);
                  piVar3 = (int *)((long)piVar3 - lVar14);
                }
              }
              piVar11 = piVar3;
            } while (bVar2);
            goto LAB_001139d5;
          }
          goto LAB_001139b2;
        }
LAB_0011393d:
        pcVar19 = "Encountered invalid depth format.";
        type = 0xffffffff;
        level = 1;
        iVar15 = 0xe9;
      }
    }
    else {
LAB_00113889:
      pcVar19 = "Encountered invalid composite mode.";
      type = 0xffffffff;
      level = 1;
      iVar15 = 0x146;
    }
  }
  icetRaiseDiagnostic(pcVar19,type,level,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/decompress_func_body.h"
                      ,iVar15);
LAB_001139d5:
  icetTimingBlendEnd();
  return;
}

Assistant:

void icetCompressedSubComposite(IceTImage destBuffer,
                                IceTSizeType offset,
                                const IceTSparseImage srcBuffer,
                                int srcOnTop)
{
    icetTimingBlendBegin();

    if (srcOnTop) {
#define INPUT_SPARSE_IMAGE      srcBuffer
#define OUTPUT_IMAGE            destBuffer
#define OFFSET                  offset
#define PIXEL_COUNT             icetSparseImageGetNumPixels(srcBuffer)
#define COMPOSITE
#define BLEND_RGBA_UBYTE        ICET_OVER_UBYTE
#define BLEND_RGBA_FLOAT        ICET_OVER_FLOAT
#include "decompress_func_body.h"
    } else {
#define INPUT_SPARSE_IMAGE      srcBuffer
#define OUTPUT_IMAGE            destBuffer
#define OFFSET                  offset
#define PIXEL_COUNT             icetSparseImageGetNumPixels(srcBuffer)
#define COMPOSITE
#define BLEND_RGBA_UBYTE        ICET_UNDER_UBYTE
#define BLEND_RGBA_FLOAT        ICET_UNDER_FLOAT
#include "decompress_func_body.h"
    }

    icetTimingBlendEnd();
}